

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Node::setError(Node *this,Twine *Msg,Token *Tok)

{
  pointer this_00;
  Token *Tok_local;
  Twine *Msg_local;
  Node *this_local;
  
  this_00 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
            operator->(this->Doc);
  Document::setError(this_00,Msg,Tok);
  return;
}

Assistant:

void Node::setError(const Twine &Msg, Token &Tok) const {
  Doc->setError(Msg, Tok);
}